

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sim_circuit.cpp
# Opt level: O0

void __thiscall lsim::SimCircuit::write_output_pins(SimCircuit *this,uint32_t comp_id,uint64_t data)

{
  uint32_t index;
  SimComponent *this_00;
  size_t sVar1;
  uint local_2c;
  uint idx;
  SimComponent *comp;
  uint64_t data_local;
  uint32_t comp_id_local;
  SimCircuit *this_local;
  
  this_00 = component_by_id(this,comp_id);
  if (this_00 != (SimComponent *)0x0) {
    local_2c = 0;
    while( true ) {
      sVar1 = SimComponent::num_outputs(this_00);
      if (sVar1 <= local_2c) break;
      index = SimComponent::output_pin_index(this_00,local_2c);
      SimComponent::set_user_value
                (this_00,index,(Value)(data >> ((byte)local_2c & 0x3f)) & VALUE_TRUE);
      local_2c = local_2c + 1;
    }
    return;
  }
  __assert_fail("comp",
                "/workspace/llm4binary/github/license_c_cmakelists/JohanSmet[P]lsim/src/sim_circuit.cpp"
                ,0xa0,"void lsim::SimCircuit::write_output_pins(uint32_t, uint64_t)");
}

Assistant:

void SimCircuit::write_output_pins(uint32_t comp_id, uint64_t data) {
    auto comp = component_by_id(comp_id);
    assert(comp);

    for (auto idx = 0u; idx < comp->num_outputs(); ++idx) {
        comp->set_user_value(comp->output_pin_index(idx), static_cast<Value>((data >> idx) & 1));
    }
}